

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn5.hpp
# Opt level: O1

ret_t trng::utility::u01xx_traits<double,_1UL,_trng::yarn5>::addin(yarn5 *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar1 = (r->S).r[0];
  iVar2 = (r->S).r[1];
  iVar3 = (r->S).r[2];
  iVar4 = (r->S).r[3];
  uVar8 = (long)(r->P).a[3] * (long)iVar4 + (long)(r->P).a[2] * (long)iVar3 +
          (long)(r->P).a[1] * (long)iVar2 + (long)(r->P).a[0] * (long)iVar1;
  uVar9 = uVar8 + 0x80000001fffffffe;
  if (uVar8 < 0x7ffffffe00000002) {
    uVar9 = uVar8;
  }
  uVar9 = (long)(r->S).r[4] * (long)(r->P).a[4] + uVar9;
  (r->S).r[4] = iVar4;
  (r->S).r[3] = iVar3;
  uVar8 = (uVar9 >> 0x1f) + (uVar9 & 0x7fffffff);
  uVar9 = uVar8 - 0x1fffffffc;
  if ((uint)(uVar8 >> 2) < 0x7fffffff) {
    uVar9 = uVar8;
  }
  uVar8 = uVar9 - 0xfffffffe;
  if (uVar9 < 0xfffffffe) {
    uVar8 = uVar9;
  }
  (r->S).r[2] = iVar2;
  (r->S).r[1] = iVar1;
  uVar5 = (uint)uVar8 + 0x80000001;
  if (uVar8 < 0x7fffffff) {
    uVar5 = (uint)uVar8;
  }
  (r->S).r[0] = uVar5;
  if (uVar5 != 0) {
    uVar6 = (uint)((ulong)*(uint *)(yarn5::g + (ulong)(uVar5 & 0xffff) * 4) *
                  (ulong)*(uint *)(yarn5::g + (long)((int)uVar5 >> 0x10) * 4 + 0x40000)) &
            0x7fffffff;
    iVar1 = (int)((ulong)*(uint *)(yarn5::g + (ulong)(uVar5 & 0xffff) * 4) *
                  (ulong)*(uint *)(yarn5::g + (long)((int)uVar5 >> 0x10) * 4 + 0x40000) >> 0x1f);
    uVar7 = uVar6 + iVar1;
    uVar5 = uVar6 + 0x80000001 + iVar1;
    if (uVar7 < 0x7fffffff) {
      uVar5 = uVar7;
    }
    return (double)(int)uVar5;
  }
  return 0.0;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn5::step() {
    uint64_t t{static_cast<uint64_t>(P.a[0]) * static_cast<uint64_t>(S.r[0]) +
               static_cast<uint64_t>(P.a[1]) * static_cast<uint64_t>(S.r[1]) +
               static_cast<uint64_t>(P.a[2]) * static_cast<uint64_t>(S.r[2]) +
               static_cast<uint64_t>(P.a[3]) * static_cast<uint64_t>(S.r[3])};
    if (t >= static_cast<uint64_t>(2u) * modulus * modulus)
      t -= static_cast<uint64_t>(2u) * modulus * modulus;
    t += static_cast<uint64_t>(P.a[4]) * static_cast<uint64_t>(S.r[4]);
    S.r[4] = S.r[3];
    S.r[3] = S.r[2];
    S.r[2] = S.r[1];
    S.r[1] = S.r[0];
    S.r[0] = int_math::modulo<modulus, 5>(t);
  }